

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O3

int32_t icu_63::MeasureUnit::internalGetIndexForTypeAndSubtype(char *type,char *subtype)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  iVar5 = 0;
  uVar6 = 0x14;
  do {
    if ((int)uVar6 <= iVar5) {
      return -1;
    }
    while( true ) {
      iVar1 = iVar5 + uVar6;
      uVar4 = iVar1 / 2;
      iVar2 = strcmp(*(char **)(gTypes + (long)(int)uVar4 * 8),type);
      if (-1 < iVar2) break;
      iVar5 = uVar4 + 1;
      if ((int)uVar6 <= iVar5) {
        return -1;
      }
    }
    uVar6 = uVar4;
    if (iVar2 == 0) {
      if (-2 < iVar1) {
        uVar7 = (ulong)uVar4;
        iVar5 = (&gOffsets)[uVar7];
        iVar1 = iVar5;
        uVar6 = *(uint *)(&DAT_003334b4 + uVar7 * 4);
        do {
          while( true ) {
            if ((int)uVar6 <= iVar1) {
              return -1;
            }
            iVar2 = iVar1 + uVar6;
            uVar4 = iVar2 / 2;
            iVar3 = strcmp(*(char **)(gSubTypes + (long)(int)uVar4 * 8),subtype);
            if (-1 < iVar3) break;
            iVar1 = uVar4 + 1;
          }
          uVar6 = uVar4;
        } while (iVar3 != 0);
        if (-2 < iVar2) {
          uVar4 = (uVar4 - iVar5) + *(int *)(gIndexes + uVar7 * 4);
        }
      }
      return uVar4;
    }
  } while( true );
}

Assistant:

int32_t MeasureUnit::internalGetIndexForTypeAndSubtype(const char *type, const char *subtype) {
    int32_t t = binarySearch(gTypes, 0, UPRV_LENGTHOF(gTypes), type);
    if (t < 0) {
        return t;
    }
    int32_t st = binarySearch(gSubTypes, gOffsets[t], gOffsets[t + 1], subtype);
    if (st < 0) {
        return st;
    }
    return gIndexes[t] + st - gOffsets[t];
}